

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void purge_invisible_characters(tgestate_t *state)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  vischar_t *in_RDI;
  tgestate_t *unaff_retaddr;
  uint8_t x;
  uint8_t y;
  vischar_t *vischar;
  uint8_t iters;
  uint8_t minx;
  uint8_t miny;
  int local_34;
  int local_2c;
  uint local_24;
  vischar_t *local_18;
  char local_b;
  
  if ((int)(*(byte *)((long)&in_RDI[0x1a].anim + 1) - 9) < 1) {
    bVar2 = 0;
  }
  else {
    bVar2 = *(char *)((long)&in_RDI[0x1a].anim + 1) - 9;
  }
  if ((int)(*(byte *)((long)&in_RDI[0x1a].anim + 2) - 9) < 1) {
    local_24 = 0;
  }
  else {
    local_24 = *(byte *)((long)&in_RDI[0x1a].anim + 2) - 9;
  }
  local_b = '\a';
  local_18 = in_RDI + 0x10;
  do {
    if (local_18->character != 0xff) {
      if (((room_t)in_RDI[4].mi.mappos.u == local_18->room) &&
         (uVar3 = (int)((local_18->isopos).y + 4) >> 3, (local_24 & 0xff) < (uVar3 & 0xff))) {
        if ((int)((local_24 & 0xff) + *(int *)((long)&in_RDI->animbase + 4) + 0x11) < 0xff) {
          local_2c = (local_24 & 0xff) + *(int *)((long)&in_RDI->animbase + 4) + 0x11;
        }
        else {
          local_2c = 0xff;
        }
        if (((int)(uVar3 & 0xff) <= local_2c) &&
           (bVar1 = (byte)((ulong)(local_18->isopos).x / 8), bVar2 < bVar1)) {
          if ((int)((uint)bVar2 + *(int *)&in_RDI->animbase + 0x12) < 0xff) {
            local_34 = (uint)bVar2 + *(int *)&in_RDI->animbase + 0x12;
          }
          else {
            local_34 = 0xff;
          }
          if ((int)(uint)bVar1 <= local_34) goto LAB_0010a4cf;
        }
      }
      reset_visible_character(unaff_retaddr,in_RDI);
    }
LAB_0010a4cf:
    local_18 = local_18 + 1;
    local_b = local_b + -1;
    if (local_b == '\0') {
      return;
    }
  } while( true );
}

Assistant:

void purge_invisible_characters(tgestate_t *state)
{
  /* Size, in UDGs, of a buffer zone around the visible screen in which
   * visible characters will persist. (Compare to the spawning size of
   * 8). */
  enum { GRACE = 9 };

  uint8_t    miny, minx;  /* was D, E */
  uint8_t    iters;       /* was B */
  vischar_t *vischar;     /* was HL */
  uint8_t    y;           /* was C */
  uint8_t    x;           /* was C */

  assert(state != NULL);

  /* Calculate clamped lower bound. */
  minx = MAX(state->map_position.x - GRACE, 0);
  miny = MAX(state->map_position.y - GRACE, 0);

  iters   = vischars_LENGTH - 1;
  vischar = &state->vischars[1]; /* iterate over non-player characters */
  do
  {
    /* Ignore inactive characters. */
    if (vischar->character == character_NONE)
      goto next;

    /* Reset this character if it's not in the current room. */
    if (state->room_index != vischar->room)
      goto reset;

    // FUTURE
    //
    // /* Calculate clamped upper bound. */
    // maxx = MIN(minx + EDGE + state->columns + EDGE, 255);
    // maxy = MIN(miny + EDGE + (state->rows - 1) + EDGE, 255);
    //
    // t = (vischar->isopos.y + 4) / 8 / 256; // round
    // if (t <= miny || t > maxy)
    //   goto reset;
    // t = (vischar->isopos.x) / 8 / 256;
    // if (t <= minx || t > maxx)
    //   goto reset;

    /* Conv: Replaced screen dimension constants with state->columns/rows. */

    /* Handle Y part */
    y = divround(vischar->isopos.y);
    /* The original code uses 16 instead of 17 for 'rows' so match that. */
    if (y <= miny || y > MIN(miny + GRACE + (state->rows - 1) + GRACE, 255))
      goto reset;

    /* Handle X part */
    x = vischar->isopos.x / 8; /* round down */
    if (x <= minx || x > MIN(minx + GRACE + state->columns + GRACE, 255))
      goto reset;

    goto next;

reset:
    reset_visible_character(state, vischar);

next:
    vischar++;
  }
  while (--iters);
}